

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_InitMatrixStack(GPU_MatrixStack *stack)

{
  float **ppfVar1;
  float *pfVar2;
  GPU_MatrixStack *stack_local;
  
  if (stack != (GPU_MatrixStack *)0x0) {
    stack->storage_size = 1;
    stack->size = 1;
    ppfVar1 = (float **)SDL_malloc((ulong)stack->storage_size << 3);
    stack->matrix = ppfVar1;
    pfVar2 = (float *)SDL_malloc(0x40);
    *stack->matrix = pfVar2;
    GPU_MatrixIdentity(*stack->matrix);
  }
  return;
}

Assistant:

void GPU_InitMatrixStack(GPU_MatrixStack* stack)
{
    if(stack == NULL)
        return;
    
    stack->storage_size = 1;
    stack->size = 1;
    
    stack->matrix = (float**)SDL_malloc(sizeof(float*) * stack->storage_size);
    stack->matrix[0] = (float*)SDL_malloc(sizeof(float) * 16);
    GPU_MatrixIdentity(stack->matrix[0]);
}